

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

FMStructDescList REVPlookup_format_structs(CManager_conflict cm,char *format_name)

{
  size_t sVar1;
  void *__ptr;
  undefined8 uVar2;
  FMStructDescList p_Var3;
  uint uVar4;
  ulong uVar5;
  char tmp [3];
  int x;
  char local_40;
  char cStack_3f;
  undefined1 local_3e;
  undefined1 local_3c [4];
  CManager_conflict local_38;
  
  local_38 = cm;
  sVar1 = strlen(format_name);
  uVar4 = (int)(((uint)(sVar1 >> 0x1f) & 1) + (int)sVar1) >> 1;
  __ptr = INT_CMmalloc((long)(int)uVar4);
  if (1 < (int)sVar1) {
    uVar5 = 0;
    do {
      local_3e = 0;
      _local_40 = CONCAT11(format_name[uVar5 * 2 + 1],format_name[uVar5 * 2]);
      __isoc99_sscanf(&local_40,"%x",local_3c);
      *(undefined1 *)((long)__ptr + uVar5) = local_3c[0];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  uVar2 = FMformat_from_ID(local_38->evp->fmc,__ptr);
  free(__ptr);
  p_Var3 = (FMStructDescList)format_list_of_FMFormat(uVar2);
  return p_Var3;
}

Assistant:

extern FMStructDescList
REVPlookup_format_structs(CManager cm, char *format_name)
{
    FMFormat format;
    int slen = (int)strlen(format_name);
    int i;
    unsigned char *id = malloc(slen/2);
    for (i=0; i < slen/2; i++) {
        int x;
        char tmp[3] = {0, 0, 0};
        tmp[0] = format_name[2*i];
        tmp[1] = format_name[2*i + 1];
        sscanf(tmp, "%x", &x);
        id[i] = (unsigned char) x;
    }
    format = FMformat_from_ID(cm->evp->fmc, (char*)id);
    free(id);
    return format_list_of_FMFormat(format);
}